

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O2

Hop_Obj_t * Hop_CreateAnd(Hop_Man_t *p,int nVars)

{
  Hop_Obj_t *p1;
  Hop_Obj_t *p0;
  int i;
  
  p0 = p->pConst1;
  i = 0;
  if (nVars < 1) {
    nVars = i;
  }
  for (; nVars != i; i = i + 1) {
    p1 = Hop_IthVar(p,i);
    p0 = Hop_And(p,p0,p1);
  }
  return p0;
}

Assistant:

Hop_Obj_t * Hop_CreateAnd( Hop_Man_t * p, int nVars )
{
    Hop_Obj_t * pFunc;
    int i;
    pFunc = Hop_ManConst1( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Hop_And( p, pFunc, Hop_IthVar(p, i) );
    return pFunc;
}